

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O1

size_t zt_hex_to_binary(char *hex,size_t hlen,void *data,size_t dlen)

{
  char cVar1;
  bool bVar2;
  int *piVar3;
  byte bVar4;
  byte bVar5;
  ulong uVar6;
  size_t sVar7;
  
  sVar7 = 0;
  if (hlen != 0) {
    sVar7 = 0;
    uVar6 = 0;
    do {
      cVar1 = *hex;
      if (cVar1 == '\0') {
        return sVar7;
      }
      if ((-(ulong)(data == (void *)0x0) | dlen) <= sVar7) {
        return sVar7;
      }
      bVar4 = cVar1 - 0x30;
      if (9 < bVar4) {
        if ((byte)(cVar1 + 0xbfU) < 6) {
          bVar4 = cVar1 - 0x37;
        }
        else {
          bVar4 = cVar1 + 0xa9;
          if (5 < (byte)(cVar1 + 0x9fU)) {
            bVar4 = 0xff;
          }
        }
      }
      if (bVar4 == 0xff) {
        hex = hex + 1;
        piVar3 = __errno_location();
        *piVar3 = 0x16;
LAB_001061c5:
        bVar2 = false;
      }
      else {
        cVar1 = hex[1];
        bVar5 = cVar1 - 0x30;
        if (9 < bVar5) {
          if ((byte)(cVar1 + 0xbfU) < 6) {
            bVar5 = cVar1 - 0x37;
          }
          else {
            bVar5 = cVar1 + 0xa9;
            if (5 < (byte)(cVar1 + 0x9fU)) {
              bVar5 = 0xff;
            }
          }
        }
        hex = hex + 2;
        if (bVar5 == 0xff) goto LAB_001061c5;
        if (data != (void *)0x0) {
          *(byte *)((long)data + sVar7) = bVar4 << 4 | bVar5 & 0xf;
        }
        uVar6 = uVar6 + 1;
        sVar7 = sVar7 + 1;
        bVar2 = true;
      }
      if (!bVar2) {
        return 0;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < hlen);
  }
  return sVar7;
}

Assistant:

size_t
zt_hex_to_binary(char *hex, size_t hlen, void *data, size_t dlen) {
    size_t n;
    size_t y = 0;

    if (data == NULL) {
        dlen = -1;
    }

    for (n = 0, y = 0; n < hlen && *hex != '\0' && y < dlen; n++) {
        int8_t c;
        int8_t c2;
        int8_t cc = 0;

        if ((c = hex_to_char(*hex++)) == -1) {
            errno = EINVAL;
            return 0;
        }

        if ((c2 = hex_to_char(*hex++)) == -1) {
            return 0;
        } else {
            n++;
        }

        cc = (c << 4) | (c2 & 0xF);

        if (data != NULL) {
            ((char *)data)[y] = (char)cc;
        }
        y++;
    }
    return y;
}